

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

bool __thiscall pbrt::Image::WritePFM(Image *this,string *filename,ImageMetadata *metadata)

{
  int iVar1;
  int iVar2;
  FILE *__stream;
  long lVar3;
  void *__s;
  size_t sVar4;
  bool bVar5;
  ulong uVar6;
  void *pvVar7;
  ulong uVar8;
  int c;
  Point2i p;
  Float FVar9;
  string ret;
  int vb;
  ulong local_50;
  string *local_48;
  FILE *local_40;
  ulong local_38;
  
  __stream = fopen((filename->_M_dataplus)._M_p,"wb");
  if (__stream == (FILE *)0x0) {
    ret._M_string_length = 0;
    ret.field_2._M_local_buf[0] = '\0';
    ret._M_dataplus._M_p = (pointer)&ret.field_2;
    detail::stringPrintfRecursive<std::__cxx11::string_const&>
              (&ret,"Unable to open output PFM file \"%s\"",filename);
    Error((FileLoc *)0x0,ret._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ret._M_dataplus._M_p != &ret.field_2) {
      operator_delete(ret._M_dataplus._M_p,
                      CONCAT71(ret.field_2._M_allocated_capacity._1_7_,ret.field_2._M_local_buf[0])
                      + 1);
    }
    return false;
  }
  lVar3 = (long)(this->resolution).super_Tuple2<pbrt::Point2,_int>.x;
  uVar6 = 0xffffffffffffffff;
  if (-1 < lVar3) {
    uVar6 = lVar3 * 0xc;
  }
  __s = operator_new__(uVar6);
  memset(__s,0,uVar6);
  iVar1 = fprintf(__stream,"PF\n");
  if (((-1 < iVar1) &&
      (iVar1 = fprintf(__stream,"%d %d\n",
                       (ulong)(uint)(this->resolution).super_Tuple2<pbrt::Point2,_int>.x,
                       (ulong)(uint)(this->resolution).super_Tuple2<pbrt::Point2,_int>.y),
      -1 < iVar1)) && (iVar1 = fprintf(__stream,"%f\n",0xbff0000000000000), -1 < iVar1)) {
    uVar6 = (ulong)(uint)(this->resolution).super_Tuple2<pbrt::Point2,_int>.y;
    local_48 = filename;
    local_40 = __stream;
    do {
      iVar1 = (int)uVar6;
      if (iVar1 < 1) {
        bVar5 = true;
        goto LAB_00272c45;
      }
      uVar6 = uVar6 - 1;
      iVar2 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.x;
      if (0 < iVar2) {
        local_50 = uVar6 << 0x20;
        uVar8 = 0;
        pvVar7 = __s;
        local_38 = uVar6;
        do {
          iVar2 = (int)(this->channelNames).nStored;
          if (iVar2 == 1) {
            FVar9 = GetChannel(this,(Point2i)(local_50 | uVar8),0,(WrapMode2D)0x200000002);
            *(Float *)((long)__s + uVar8 * 0xc + 8) = FVar9;
            *(Float *)((long)__s + uVar8 * 0xc + 4) = FVar9;
            *(Float *)((long)__s + uVar8 * 0xc) = FVar9;
          }
          else {
            ret._M_dataplus._M_p._0_4_ = 3;
            if (iVar2 != 3) {
              vb = iVar2;
              LogFatal<char_const(&)[2],char_const(&)[12],char_const(&)[2],int&,char_const(&)[12],int&>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp"
                         ,0x630,"Check failed: %s == %s with %s = %s, %s = %s",
                         (char (*) [2])0x458bf1,(char (*) [12])0x45c077,(char (*) [2])0x458bf1,
                         (int *)&ret,(char (*) [12])0x45c077,&vb);
            }
            p.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(local_50 | uVar8);
            lVar3 = 0;
            vb = 3;
            do {
              FVar9 = GetChannel(this,p,(int)lVar3,(WrapMode2D)0x200000002);
              *(Float *)((long)pvVar7 + lVar3 * 4) = FVar9;
              lVar3 = lVar3 + 1;
            } while (lVar3 != 3);
          }
          uVar8 = uVar8 + 1;
          iVar2 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.x;
          pvVar7 = (void *)((long)pvVar7 + 0xc);
          uVar6 = local_38;
          __stream = local_40;
        } while ((long)uVar8 < (long)iVar2);
      }
      sVar4 = fwrite(__s,4,(long)(iVar2 * 3),__stream);
    } while ((ulong)((long)(this->resolution).super_Tuple2<pbrt::Point2,_int>.x * 3) <= sVar4);
    bVar5 = true;
    filename = local_48;
    if (iVar1 < 1) goto LAB_00272c45;
  }
  ret._M_string_length = 0;
  ret.field_2._M_local_buf[0] = '\0';
  ret._M_dataplus._M_p = (pointer)&ret.field_2;
  detail::stringPrintfRecursive<std::__cxx11::string_const&>
            (&ret,"Error writing PFM file \"%s\"",filename);
  Error((FileLoc *)0x0,ret._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)ret._M_dataplus._M_p != &ret.field_2) {
    operator_delete(ret._M_dataplus._M_p,
                    CONCAT71(ret.field_2._M_allocated_capacity._1_7_,ret.field_2._M_local_buf[0]) +
                    1);
  }
  bVar5 = false;
LAB_00272c45:
  fclose(__stream);
  operator_delete__(__s);
  return bVar5;
}

Assistant:

bool Image::WritePFM(const std::string &filename, const ImageMetadata &metadata) const {
    FILE *fp = fopen(filename.c_str(), "wb");
    if (fp == nullptr) {
        Error("Unable to open output PFM file \"%s\"", filename);
        return false;
    }

    std::unique_ptr<float[]> scanline = std::make_unique<float[]>(3 * resolution.x);
    float scale;

    // only write 3 channel PFMs here...
    if (fprintf(fp, "PF\n") < 0)
        goto fail;

    // write the width and height, which must be positive
    if (fprintf(fp, "%d %d\n", resolution.x, resolution.y) < 0)
        goto fail;

    // write the scale, which encodes endianness
    scale = hostLittleEndian ? -1.f : 1.f;
    if (fprintf(fp, "%f\n", scale) < 0)
        goto fail;

    // write the data from bottom left to upper right as specified by
    // http://netpbm.sourceforge.net/doc/pfm.html
    // The raster is a sequence of pixels, packed one after another, with no
    // delimiters of any kind. They are grouped by row, with the pixels in each
    // row ordered left to right and the rows ordered bottom to top.
    for (int y = resolution.y - 1; y >= 0; y--) {
        for (int x = 0; x < resolution.x; ++x) {
            if (NChannels() == 1) {
                Float v = GetChannel({x, y}, 0);
                scanline[3 * x] = scanline[3 * x + 1] = scanline[3 * x + 2] = v;
            } else {
                CHECK_EQ(3, NChannels());
                for (int c = 0; c < 3; ++c)
                    // Assign element-wise in case Float is typedefed as
                    // 'double'.
                    scanline[3 * x + c] = GetChannel({x, y}, c);
            }
        }
        if (fwrite(&scanline[0], sizeof(float), 3 * resolution.x, fp) <
            (size_t)(3 * resolution.x))
            goto fail;
    }

    fclose(fp);
    return true;

fail:
    Error("Error writing PFM file \"%s\"", filename);
    fclose(fp);
    return false;
}